

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qstringbuilder.h
# Opt level: O1

QByteArray *
QtStringBuilder::appendToByteArray<QStringBuilder<char_const*&,QByteArray>,QByteArray>
          (QByteArray *a,QStringBuilder<QStringBuilder<const_char_*&,_QByteArray>,_QByteArray> *b,
          char param_3)

{
  ArrayOptions *pAVar1;
  char cVar2;
  Data *pDVar3;
  long lVar4;
  size_t __n;
  size_t sVar5;
  char *pcVar6;
  long lVar7;
  char *__dest;
  long size;
  
  lVar7 = (a->d).size;
  pcVar6 = *(b->a).a;
  if (pcVar6 == (char *)0x0) {
    sVar5 = 0;
  }
  else {
    sVar5 = strlen(pcVar6);
  }
  size = sVar5 + lVar7 + (b->a).b.d.size + (b->b).d.size;
  pDVar3 = (a->d).d;
  if ((pDVar3 == (Data *)0x0) ||
     (1 < (pDVar3->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i)) {
    QByteArray::reallocData(a,lVar7,KeepSize);
  }
  pDVar3 = (a->d).d;
  if (pDVar3 == (Data *)0x0) {
    lVar7 = 0;
  }
  else {
    lVar7 = (((ulong)((long)&pDVar3[1].super_QArrayData.alloc + 7U) & 0xfffffffffffffff0) +
            (pDVar3->super_QArrayData).alloc) - (long)((a->d).ptr + (a->d).size);
  }
  if (lVar7 < size) {
    if (pDVar3 == (Data *)0x0) {
      lVar7 = 0;
    }
    else {
      lVar7 = (pDVar3->super_QArrayData).alloc * 2;
    }
    if (lVar7 < size) {
      lVar7 = size;
    }
    if (((pDVar3 == (Data *)0x0) ||
        (1 < (pDVar3->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i)) ||
       ((long)((((ulong)((long)&pDVar3[1].super_QArrayData.alloc + 7U) & 0xfffffffffffffff0) +
               (pDVar3->super_QArrayData).alloc) - (long)(a->d).ptr) < lVar7)) {
      lVar4 = (a->d).size;
      if (lVar7 < lVar4) {
        lVar7 = lVar4;
      }
      QByteArray::reallocData(a,lVar7,KeepSize);
    }
    pDVar3 = (a->d).d;
    if ((pDVar3 != (Data *)0x0) && ((pDVar3->super_QArrayData).alloc != 0)) {
      pAVar1 = &(pDVar3->super_QArrayData).flags;
      *(byte *)&(pAVar1->super_QFlagsStorageHelper<QArrayData::ArrayOption,_4>).
                super_QFlagsStorage<QArrayData::ArrayOption>.i =
           (byte)(pAVar1->super_QFlagsStorageHelper<QArrayData::ArrayOption,_4>).
                 super_QFlagsStorage<QArrayData::ArrayOption>.i | 1;
    }
  }
  pDVar3 = (a->d).d;
  if ((pDVar3 == (Data *)0x0) ||
     (1 < (pDVar3->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i)) {
    QByteArray::reallocData(a,(a->d).size,KeepSize);
  }
  __dest = (a->d).ptr + (a->d).size;
  pcVar6 = *(b->a).a;
  if (pcVar6 != (char *)0x0) {
    cVar2 = *pcVar6;
    while (cVar2 != '\0') {
      pcVar6 = pcVar6 + 1;
      *__dest = cVar2;
      __dest = __dest + 1;
      cVar2 = *pcVar6;
    }
  }
  sVar5 = (b->a).b.d.size;
  if (sVar5 != 0) {
    memcpy(__dest,(b->a).b.d.ptr,sVar5);
  }
  __n = (b->b).d.size;
  if (__n != 0) {
    memcpy(__dest + sVar5,(b->b).d.ptr,__n);
  }
  QByteArray::resize(a,size);
  return a;
}

Assistant:

QByteArray &appendToByteArray(QByteArray &a, const QStringBuilder<A, B> &b, char)
{
    // append 8-bit data to a byte array
    qsizetype len = a.size() + QConcatenable< QStringBuilder<A, B> >::size(b);
    a.detach(); // a detach() in a.data() could reset a.capacity() to a.size()
    if (len > a.data_ptr().freeSpaceAtEnd()) // capacity() was broken when prepend()-optimization landed
        a.reserve(qMax(len, 2 * a.capacity()));
    char *it = a.data() + a.size();
    QConcatenable< QStringBuilder<A, B> >::appendTo(b, it);
    a.resize(len); //we need to resize after the appendTo for the case str+=foo+str
    return a;
}